

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

string_view __thiscall inja::convert_dot_to_json_pointer(inja *this,string_view dot,string *out)

{
  const_pointer __first;
  string_view *this_00;
  char *__last;
  const_pointer pcVar1;
  string_view view;
  pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  this_00 = (string_view *)dot.size_;
  pcVar1 = dot.data_;
  this_00->size_ = 0;
  *this_00->data_ = '\0';
  do {
    view.size_ = (size_type)pcVar1;
    view.data_ = (const_pointer)this;
    string_view::split(&local_50,view,'.');
    pcVar1 = (const_pointer)local_50.second.size_;
    this = (inja *)local_50.second.data_;
    __first = local_50.first.data_;
    __last = local_50.first.data_ + local_50.first.size_;
    std::__cxx11::string::push_back((char)dot.size_);
    std::__cxx11::string::append<char_const*,void>((string *)this_00,__first,__last);
  } while (pcVar1 != (const_pointer)0x0);
  return *this_00;
}

Assistant:

inline nonstd::string_view convert_dot_to_json_pointer(nonstd::string_view dot, std::string& out) {
	out.clear();
	do {
		nonstd::string_view part;
		std::tie(part, dot) = string_view::split(dot, '.');
		out.push_back('/');
		out.append(part.begin(), part.end());
	} while (!dot.empty());
	return nonstd::string_view(out.data(), out.size());
}